

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::updateGeometries(QTableView *this)

{
  Representation RVar1;
  Representation RVar2;
  Representation RVar3;
  long lVar4;
  long lVar5;
  QHeaderViewPrivate *this_00;
  bool bVar6;
  bool bVar7;
  Representation RVar8;
  LayoutDirection LVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ScrollMode SVar14;
  QSize QVar15;
  int extraout_var;
  QScrollBar *pQVar16;
  int width;
  Representation RVar17;
  int iVar18;
  int iVar19;
  Representation RVar20;
  Representation RVar21;
  int iVar22;
  int height;
  long in_FS_OFFSET;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  if (*(char *)(lVar4 + 0x641) == '\0') {
    *(undefined1 *)(lVar4 + 0x641) = 1;
    RVar8.m_i = 0;
    if (((*(QWidget **)(lVar4 + 0x588))->data->widget_attributes & 0x10000) == 0) {
      QVar15 = QWidget::minimumSize(*(QWidget **)(lVar4 + 0x588));
      RVar8.m_i = (**(code **)(**(long **)(lVar4 + 0x588) + 0x70))();
      if (RVar8.m_i < QVar15.wd.m_i.m_i) {
        RVar8.m_i = QVar15.wd.m_i.m_i;
      }
      QVar15 = QWidget::maximumSize(*(QWidget **)(lVar4 + 0x588));
      if (QVar15.wd.m_i.m_i <= RVar8.m_i) {
        RVar8.m_i = QVar15.wd.m_i.m_i;
      }
    }
    RVar21.m_i = 0;
    if (((*(QWidget **)(lVar4 + 0x580))->data->widget_attributes & 0x10000) == 0) {
      QVar15 = QWidget::minimumSize(*(QWidget **)(lVar4 + 0x580));
      (**(code **)(**(long **)(lVar4 + 0x580) + 0x70))();
      RVar21.m_i = extraout_var;
      if (extraout_var < QVar15.ht.m_i.m_i) {
        RVar21.m_i = QVar15.ht.m_i.m_i;
      }
      QVar15 = QWidget::maximumSize(*(QWidget **)(lVar4 + 0x580));
      if (QVar15.ht.m_i.m_i <= RVar21.m_i) {
        RVar21.m_i = QVar15.ht.m_i.m_i;
      }
    }
    LVar9 = QWidget::layoutDirection((QWidget *)this);
    if (LVar9 == RightToLeft) {
      iVar22 = RVar8.m_i;
      iVar12 = 0;
    }
    else {
      iVar22 = 0;
      iVar12 = RVar8.m_i;
    }
    QAbstractScrollArea::setViewportMargins((QAbstractScrollArea *)this,iVar12,RVar21.m_i,iVar22,0);
    lVar5 = *(long *)(*(long *)(lVar4 + 0x2b0) + 0x20);
    RVar1.m_i = *(int *)(lVar5 + 0x14);
    RVar2.m_i = *(int *)(lVar5 + 0x18);
    RVar3.m_i = *(int *)(lVar5 + 0x1c);
    RVar20.m_i = RVar1.m_i - RVar8.m_i;
    if (LVar9 == RightToLeft) {
      RVar20.m_i = RVar3.m_i + 1;
    }
    local_58._4_4_ = RVar2.m_i;
    local_58._0_4_ = RVar20.m_i;
    RVar17.m_i = RVar8.m_i + RVar20.m_i + -1;
    uStack_50 = (char *)CONCAT44(*(int *)(lVar5 + 0x20),RVar17.m_i);
    QWidget::setGeometry(*(QWidget **)(lVar4 + 0x588),(QRect *)local_58);
    if ((*(byte *)(*(long *)(*(QObject **)(lVar4 + 0x588) + 0x20) + 10) & 1) != 0) {
      local_58 = (undefined1  [8])0x0;
      uStack_50 = (char *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (*(QObject **)(lVar4 + 0x588),"updateGeometries",AutoConnection,1,(void **)local_58,
                 (char **)&uStack_50,local_48);
    }
    local_58._4_4_ = RVar2.m_i - RVar21.m_i;
    local_58._0_4_ = RVar1.m_i;
    uStack_50 = (char *)CONCAT44(RVar2.m_i + -1,RVar3.m_i);
    QWidget::setGeometry(*(QWidget **)(lVar4 + 0x580),(QRect *)local_58);
    if ((*(byte *)(*(long *)(*(QObject **)(lVar4 + 0x580) + 0x20) + 10) & 1) != 0) {
      local_58 = (undefined1  [8])0x0;
      uStack_50 = (char *)0x0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (*(QObject **)(lVar4 + 0x580),"updateGeometries",AutoConnection,1,(void **)local_58,
                 (char **)&uStack_50,local_48);
    }
    if (((*(byte *)(*(long *)(*(long *)(lVar4 + 0x580) + 0x20) + 10) & 1) == 0) &&
       ((*(byte *)(*(long *)(*(long *)(lVar4 + 0x588) + 0x20) + 10) & 1) == 0)) {
      QWidget::setHidden(*(QWidget **)(lVar4 + 0x590),false);
      local_58._0_4_ = RVar20.m_i;
      uStack_50 = (char *)CONCAT44(RVar2.m_i + -1,RVar17.m_i);
      QWidget::setGeometry(*(QWidget **)(lVar4 + 0x590),(QRect *)local_58);
    }
    else {
      QWidget::setHidden(*(QWidget **)(lVar4 + 0x590),true);
    }
    lVar5 = *(long *)(*(long *)(lVar4 + 0x2b0) + 0x20);
    iVar22 = *(int *)(lVar5 + 0x1c);
    iVar12 = *(int *)(lVar5 + 0x20);
    iVar18 = *(int *)(lVar5 + 0x14);
    iVar19 = *(int *)(lVar5 + 0x18);
    QVar15 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this);
    iVar10 = QHeaderView::length(*(QHeaderView **)(lVar4 + 0x580));
    iVar11 = QHeaderView::length(*(QHeaderView **)(lVar4 + 0x588));
    RVar21.m_i = (iVar22 - iVar18) + 1;
    RVar8.m_i = (iVar12 - iVar19) + 1;
    if (iVar11 <= QVar15.ht.m_i.m_i && iVar10 <= QVar15.wd.m_i.m_i) {
      RVar21.m_i = QVar15.wd.m_i.m_i;
      RVar8.m_i = QVar15.ht.m_i.m_i;
    }
    iVar12 = QHeaderView::count(*(QHeaderView **)(lVar4 + 0x580));
    iVar19 = 0;
    iVar18 = 0;
    iVar22 = iVar12;
    do {
      if (iVar22 < 1) break;
      iVar22 = iVar22 + -1;
      iVar13 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar4 + 0x580),iVar22);
      bVar7 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar4 + 0x580),iVar13);
      bVar6 = true;
      if (!bVar7) {
        iVar13 = QHeaderView::sectionSize(*(QHeaderView **)(lVar4 + 0x580),iVar13);
        iVar18 = iVar18 + iVar13;
        bVar6 = iVar18 <= RVar21.m_i;
        iVar19 = iVar19 + (uint)bVar6;
      }
    } while (bVar6);
    iVar22 = 1;
    if (1 < iVar19) {
      iVar22 = iVar19;
    }
    SVar14 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    if (SVar14 == ScrollPerItem) {
      iVar18 = QHeaderView::hiddenSectionCount(*(QHeaderView **)(lVar4 + 0x580));
      pQVar16 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar16->super_QAbstractSlider,0,(iVar12 - iVar18) - iVar22);
      pQVar16 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar16->super_QAbstractSlider,iVar22);
      if (iVar12 - iVar18 <= iVar22) {
        QHeaderView::setOffset(*(QHeaderView **)(lVar4 + 0x580),0);
      }
      pQVar16 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setSingleStep(&pQVar16->super_QAbstractSlider,1);
    }
    else {
      pQVar16 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar16->super_QAbstractSlider,RVar21.m_i);
      pQVar16 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar16->super_QAbstractSlider,0,iVar10 - RVar21.m_i);
      pQVar16 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar12 = RVar21.m_i / (iVar22 + 1);
      iVar22 = 2;
      if (2 < iVar12) {
        iVar22 = iVar12;
      }
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (*(QAbstractSliderPrivate **)
                  &(pQVar16->super_QAbstractSlider).super_QWidget.field_0x8,iVar22);
    }
    iVar12 = QHeaderView::count(*(QHeaderView **)(lVar4 + 0x588));
    iVar18 = 0;
    iVar19 = 0;
    iVar22 = iVar12;
    do {
      if (iVar22 < 1) break;
      iVar22 = iVar22 + -1;
      iVar10 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar4 + 0x588),iVar22);
      bVar7 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar4 + 0x588),iVar10);
      bVar6 = true;
      if (!bVar7) {
        iVar10 = QHeaderView::sectionSize(*(QHeaderView **)(lVar4 + 0x588),iVar10);
        iVar19 = iVar19 + iVar10;
        bVar6 = iVar19 <= RVar8.m_i;
        iVar18 = iVar18 + (uint)bVar6;
      }
    } while (bVar6);
    iVar22 = 1;
    if (1 < iVar18) {
      iVar22 = iVar18;
    }
    SVar14 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
    if (SVar14 == ScrollPerItem) {
      iVar18 = QHeaderView::hiddenSectionCount(*(QHeaderView **)(lVar4 + 0x588));
      pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar16->super_QAbstractSlider,0,(iVar12 - iVar18) - iVar22);
      pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar16->super_QAbstractSlider,iVar22);
      if (iVar12 - iVar18 <= iVar22) {
        QHeaderView::setOffset(*(QHeaderView **)(lVar4 + 0x588),0);
      }
      pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setSingleStep(&pQVar16->super_QAbstractSlider,1);
    }
    else {
      pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setPageStep(&pQVar16->super_QAbstractSlider,RVar8.m_i);
      pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setRange(&pQVar16->super_QAbstractSlider,0,iVar11 - RVar8.m_i);
      pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar12 = RVar8.m_i / (iVar22 + 1);
      iVar22 = 2;
      if (2 < iVar12) {
        iVar22 = iVar12;
      }
      QAbstractSliderPrivate::itemviewChangeSingleStep
                (*(QAbstractSliderPrivate **)
                  &(pQVar16->super_QAbstractSlider).super_QWidget.field_0x8,iVar22);
    }
    this_00 = *(QHeaderViewPrivate **)(*(long *)(lVar4 + 0x588) + 8);
    pQVar16 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    SVar14 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
    QHeaderViewPrivate::setScrollOffset(this_00,pQVar16,SVar14);
    *(undefined1 *)(lVar4 + 0x641) = 0;
    QAbstractItemView::updateGeometries((QAbstractItemView *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::updateGeometries()
{
    Q_D(QTableView);
    if (d->geometryRecursionBlock)
        return;
    d->geometryRecursionBlock = true;

    int width = 0;
    if (!d->verticalHeader->isHidden()) {
        width = qMax(d->verticalHeader->minimumWidth(), d->verticalHeader->sizeHint().width());
        width = qMin(width, d->verticalHeader->maximumWidth());
    }
    int height = 0;
    if (!d->horizontalHeader->isHidden()) {
        height = qMax(d->horizontalHeader->minimumHeight(), d->horizontalHeader->sizeHint().height());
        height = qMin(height, d->horizontalHeader->maximumHeight());
    }
    bool reverse = isRightToLeft();
     if (reverse)
         setViewportMargins(0, height, width, 0);
     else
         setViewportMargins(width, height, 0, 0);

    // update headers

    QRect vg = d->viewport->geometry();

    int verticalLeft = reverse ? vg.right() + 1 : (vg.left() - width);
    d->verticalHeader->setGeometry(verticalLeft, vg.top(), width, vg.height());
    if (d->verticalHeader->isHidden())
        QMetaObject::invokeMethod(d->verticalHeader, "updateGeometries");

    int horizontalTop = vg.top() - height;
    d->horizontalHeader->setGeometry(vg.left(), horizontalTop, vg.width(), height);
    if (d->horizontalHeader->isHidden())
        QMetaObject::invokeMethod(d->horizontalHeader, "updateGeometries");

#if QT_CONFIG(abstractbutton)
    // update cornerWidget
    if (d->horizontalHeader->isHidden() || d->verticalHeader->isHidden()) {
        d->cornerWidget->setHidden(true);
    } else {
        d->cornerWidget->setHidden(false);
        d->cornerWidget->setGeometry(verticalLeft, horizontalTop, width, height);
    }
#endif

    // update scroll bars

    // ### move this block into the if
    QSize vsize = d->viewport->size();
    QSize max = maximumViewportSize();
    const int horizontalLength = d->horizontalHeader->length();
    const int verticalLength = d->verticalHeader->length();
    if (max.width() >= horizontalLength && max.height() >= verticalLength)
        vsize = max;

    // horizontal scroll bar
    const int columnCount = d->horizontalHeader->count();
    const int viewportWidth = vsize.width();
    int columnsInViewport = 0;
    for (int width = 0, column = columnCount - 1; column >= 0; --column) {
        int logical = d->horizontalHeader->logicalIndex(column);
        if (!d->horizontalHeader->isSectionHidden(logical)) {
            width += d->horizontalHeader->sectionSize(logical);
            if (width > viewportWidth)
                break;
            ++columnsInViewport;
        }
    }
    columnsInViewport = qMax(columnsInViewport, 1); //there must be always at least 1 column

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
        const int visibleColumns = columnCount - d->horizontalHeader->hiddenSectionCount();
        horizontalScrollBar()->setRange(0, visibleColumns - columnsInViewport);
        horizontalScrollBar()->setPageStep(columnsInViewport);
        if (columnsInViewport >= visibleColumns)
            d->horizontalHeader->setOffset(0);
        horizontalScrollBar()->setSingleStep(1);
    } else { // ScrollPerPixel
        horizontalScrollBar()->setPageStep(vsize.width());
        horizontalScrollBar()->setRange(0, horizontalLength - vsize.width());
        horizontalScrollBar()->d_func()->itemviewChangeSingleStep(qMax(vsize.width() / (columnsInViewport + 1), 2));
    }

    // vertical scroll bar
    const int rowCount = d->verticalHeader->count();
    const int viewportHeight = vsize.height();
    int rowsInViewport = 0;
    for (int height = 0, row = rowCount - 1; row >= 0; --row) {
        int logical = d->verticalHeader->logicalIndex(row);
        if (!d->verticalHeader->isSectionHidden(logical)) {
            height += d->verticalHeader->sectionSize(logical);
            if (height > viewportHeight)
                break;
            ++rowsInViewport;
        }
    }
    rowsInViewport = qMax(rowsInViewport, 1); //there must be always at least 1 row

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
        const int visibleRows = rowCount - d->verticalHeader->hiddenSectionCount();
        verticalScrollBar()->setRange(0, visibleRows - rowsInViewport);
        verticalScrollBar()->setPageStep(rowsInViewport);
        if (rowsInViewport >= visibleRows)
            d->verticalHeader->setOffset(0);
        verticalScrollBar()->setSingleStep(1);
    } else { // ScrollPerPixel
        verticalScrollBar()->setPageStep(vsize.height());
        verticalScrollBar()->setRange(0, verticalLength - vsize.height());
        verticalScrollBar()->d_func()->itemviewChangeSingleStep(qMax(vsize.height() / (rowsInViewport + 1), 2));
    }
    d->verticalHeader->d_func()->setScrollOffset(verticalScrollBar(), verticalScrollMode());

    d->geometryRecursionBlock = false;
    QAbstractItemView::updateGeometries();
}